

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall
QCss::ValueExtractor::extractFont(ValueExtractor *this,QFont *font,int *fontSizeAdjustment)

{
  bool bVar1;
  Value *value;
  qsizetype qVar2;
  QFont *font_00;
  const_reference value_00;
  DeclarationData *pDVar3;
  undefined4 uVar4;
  uint *in_RDX;
  QFont *in_RDI;
  long in_FS_OFFSET;
  Value *val;
  Declaration *decl;
  int i;
  bool hit;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  Value *in_stack_ffffffffffffff80;
  int iVar5;
  uint in_stack_ffffffffffffffac;
  uint uVar6;
  bool local_31;
  int *in_stack_ffffffffffffffe8;
  QFont *in_stack_fffffffffffffff0;
  Value *value_01;
  
  value_01 = *(Value **)(in_FS_OFFSET + 0x28);
  if (*(int *)&in_RDI[2].field_0xc == 0) {
    uVar6 = in_stack_ffffffffffffffac & 0xffffff;
    iVar5 = 0;
    while( true ) {
      value = (Value *)(long)iVar5;
      qVar2 = QList<QCss::Declaration>::size((QList<QCss::Declaration> *)in_RDI);
      if (qVar2 <= (long)value) break;
      font_00 = (QFont *)QList<QCss::Declaration>::at
                                   ((QList<QCss::Declaration> *)in_stack_ffffffffffffff80,
                                    CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa3295e);
      bVar1 = QList<QCss::Value>::isEmpty((QList<QCss::Value> *)0xa3296a);
      if (!bVar1) {
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa3298e);
        value_00 = QList<QCss::Value>::at
                             ((QList<QCss::Value> *)in_stack_ffffffffffffff80,
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                           ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                            0xa329ad);
        in_stack_ffffffffffffff80 = (Value *)(ulong)(pDVar3->propertyId - Font);
        switch(in_stack_ffffffffffffff80) {
        case (Value *)0x0:
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa32a90);
          parseShorthandFontProperty((QList<QCss::Value> *)font_00,(QFont *)value_00,(int *)in_RDI);
          break;
        case (Value *)0x1:
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa32a3d);
          setFontFamilyFromValues
                    ((QList<QCss::Value> *)CONCAT44(uVar6,iVar5),font_00,
                     (int)((ulong)value_00 >> 0x20));
          break;
        case (Value *)0x2:
          Value::Value(in_stack_ffffffffffffff80,
                       (Value *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          setFontSizeFromValue(value_01,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
          Value::~Value((Value *)0xa32a06);
          break;
        case (Value *)0x3:
          setFontStyleFromValue(value,(QFont *)in_stack_ffffffffffffff80);
          break;
        case (Value *)0x4:
          setFontWeightFromValue(value_00,in_RDI);
          break;
        default:
          goto LAB_00a32af3;
        case (Value *)0xf:
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa32a73);
          setTextDecorationFromValues((QList<QCss::Value> *)in_RDI,(QFont *)value);
          break;
        case (Value *)0x5f:
          setFontVariantFromValue
                    (in_stack_ffffffffffffff80,
                     (QFont *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          break;
        case (Value *)0x60:
          setTextTransformFromValue
                    (in_stack_ffffffffffffff80,
                     (QFont *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          break;
        case (Value *)0x65:
          setFontKerningFromValue(value,(QFont *)in_stack_ffffffffffffff80);
          break;
        case (Value *)0x68:
          setLetterSpacingFromValue((Value *)CONCAT44(uVar6,iVar5),font_00);
          break;
        case (Value *)0x69:
          setWordSpacingFromValue(value_00,in_RDI);
        }
        uVar6 = CONCAT13(1,(int3)uVar6);
      }
LAB_00a32af3:
      iVar5 = iVar5 + 1;
    }
    QFont::operator=((QFont *)in_stack_ffffffffffffff80,
                     (QFont *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    in_RDI[2].resolve_mask = *in_RDX;
    uVar4 = 2;
    if ((uVar6 & 0x1000000) != 0) {
      uVar4 = 1;
    }
    *(undefined4 *)&in_RDI[2].field_0xc = uVar4;
    local_31 = (bool)((byte)(uVar6 >> 0x18) & 1);
  }
  else {
    QFont::operator=((QFont *)in_stack_ffffffffffffff80,
                     (QFont *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    *in_RDX = in_RDI[2].resolve_mask;
    local_31 = *(int *)&in_RDI[2].field_0xc == 1;
  }
  if (*(Value **)(in_FS_OFFSET + 0x28) == value_01) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool ValueExtractor::extractFont(QFont *font, int *fontSizeAdjustment)
{
    if (fontExtracted) {
        *font = f;
        *fontSizeAdjustment = adjustment;
        return fontExtracted == 1;
    }

    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        if (decl.d->values.isEmpty())
            continue;
        const QCss::Value &val = decl.d->values.at(0);
        switch (decl.d->propertyId) {
            case FontSize: setFontSizeFromValue(val, font, fontSizeAdjustment); break;
            case FontStyle: setFontStyleFromValue(val, font); break;
            case FontWeight: setFontWeightFromValue(val, font); break;
            case FontFamily: setFontFamilyFromValues(decl.d->values, font); break;
            case FontKerning: setFontKerningFromValue(val, font); break;
            case TextDecoration: setTextDecorationFromValues(decl.d->values, font); break;
            case Font: parseShorthandFontProperty(decl.d->values, font, fontSizeAdjustment); break;
            case FontVariant: setFontVariantFromValue(val, font); break;
            case TextTransform: setTextTransformFromValue(val, font); break;
            case LetterSpacing: setLetterSpacingFromValue(val, font); break;
            case WordSpacing: setWordSpacingFromValue(val, font); break;
            default: continue;
        }
        hit = true;
    }

    f = *font;
    adjustment = *fontSizeAdjustment;
    fontExtracted = hit ? 1 : 2;
    return hit;
}